

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O3

void nn_append_string(nn_parse_context *ctx,nn_option *opt,char *str)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  long lVar4;
  
  pvVar2 = ctx->target;
  if (pvVar2 == (void *)0x0) {
    nn_append_string_cold_2();
  }
  else {
    lVar4 = (long)(int)opt;
    if (*(void **)((long)pvVar2 + lVar4) == (void *)0x0) {
      pvVar3 = malloc(8);
      *(undefined4 *)((long)pvVar2 + lVar4 + 0x10) = 1;
    }
    else {
      iVar1 = *(int *)((long)pvVar2 + lVar4 + 0x10);
      *(int *)((long)pvVar2 + lVar4 + 0x10) = iVar1 + 1;
      pvVar3 = realloc(*(void **)((long)pvVar2 + lVar4),(long)iVar1 * 8 + 8);
    }
    *(void **)((long)pvVar2 + lVar4) = pvVar3;
    if (pvVar3 != (void *)0x0) {
      *(char **)((long)pvVar3 + (long)*(int *)((long)pvVar2 + lVar4 + 0x10) * 8 + -8) = str;
      return;
    }
  }
  nn_append_string_cold_1();
}

Assistant:

static void nn_append_string (struct nn_parse_context *ctx,
                             struct nn_option *opt, char *str)
{
    struct nn_string_list *lst;

    lst = (struct nn_string_list *)(((char *)ctx->target) + opt->offset);
    nn_assert (lst);
    if (lst->items) {
        lst->num += 1;
        lst->items = realloc (lst->items, sizeof (char *) * lst->num);
    } else {
        lst->items = malloc (sizeof (char *));
        lst->num = 1;
    }
    if (!lst->items) {
        nn_memory_error (ctx);
    }

    nn_assert (lst && lst->items);
    lst->items [lst->num - 1] = str;
}